

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O1

int TvCtrlPointRemoveDevice(char *UDN)

{
  int iVar1;
  TvDeviceNode *pTVar2;
  TvDeviceNode *node;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  node = GlobalDeviceList;
  if (GlobalDeviceList == (TvDeviceNode *)0x0) {
    SampleUtil_Print("WARNING: TvCtrlPointRemoveDevice: Device list empty\n");
  }
  else {
    iVar1 = strcmp((char *)GlobalDeviceList,UDN);
    if (iVar1 == 0) {
      GlobalDeviceList = node->next;
    }
    else {
      do {
        pTVar2 = node;
        node = pTVar2->next;
        if (node == (TvDeviceNode *)0x0) goto LAB_001045c5;
        iVar1 = strcmp((char *)node,UDN);
      } while (iVar1 != 0);
      pTVar2->next = node->next;
    }
    TvCtrlPointDeleteNode(node);
  }
LAB_001045c5:
  pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
  return 0;
}

Assistant:

int TvCtrlPointRemoveDevice(const char *UDN)
{
	struct TvDeviceNode *curdevnode;
	struct TvDeviceNode *prevdevnode;

	ithread_mutex_lock(&DeviceListMutex);

	curdevnode = GlobalDeviceList;
	if (!curdevnode) {
		SampleUtil_Print("WARNING: TvCtrlPointRemoveDevice: Device "
				 "list empty\n");
	} else {
		if (0 == strcmp(curdevnode->device.UDN, UDN)) {
			GlobalDeviceList = curdevnode->next;
			TvCtrlPointDeleteNode(curdevnode);
		} else {
			prevdevnode = curdevnode;
			curdevnode = curdevnode->next;
			while (curdevnode) {
				if (strcmp(curdevnode->device.UDN, UDN) == 0) {
					prevdevnode->next = curdevnode->next;
					TvCtrlPointDeleteNode(curdevnode);
					break;
				}
				prevdevnode = curdevnode;
				curdevnode = curdevnode->next;
			}
		}
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return TV_SUCCESS;
}